

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int tcptran_listener_setopt(void *arg,char *name,void *buf,size_t sz,nni_type t)

{
  int local_3c;
  int rv;
  tcptran_ep *ep;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  char *name_local;
  void *arg_local;
  
  local_3c = nni_stream_listener_set(*(nng_stream_listener **)((long)arg + 0x418),name,buf,sz,t);
  if (local_3c == 9) {
    local_3c = nni_setopt(tcptran_ep_opts,name,arg,buf,sz,t);
  }
  return local_3c;
}

Assistant:

static int
tcptran_listener_setopt(
    void *arg, const char *name, const void *buf, size_t sz, nni_type t)
{
	tcptran_ep *ep = arg;
	int         rv;

	rv = nni_stream_listener_set(ep->listener, name, buf, sz, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_setopt(tcptran_ep_opts, name, ep, buf, sz, t);
	}
	return (rv);
}